

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_double_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_fe *rzr)

{
  secp256k1_fe *rzr_local;
  secp256k1_gej *a_local;
  secp256k1_gej *r_local;
  
  if (a->infinity == 0) {
    if (rzr != (secp256k1_fe *)0x0) {
      memcpy(rzr,&a->y,0x28);
      secp256k1_fe_normalize_weak(rzr);
      secp256k1_fe_mul_int(rzr,2);
    }
    secp256k1_gej_double(r,a);
  }
  else {
    r->infinity = 1;
    if (rzr != (secp256k1_fe *)0x0) {
      secp256k1_fe_set_int(rzr,1);
    }
  }
  return;
}

Assistant:

static void secp256k1_gej_double_var(secp256k1_gej *r, const secp256k1_gej *a, secp256k1_fe *rzr) {
    /** For secp256k1, 2Q is infinity if and only if Q is infinity. This is because if 2Q = infinity,
     *  Q must equal -Q, or that Q.y == -(Q.y), or Q.y is 0. For a point on y^2 = x^3 + 7 to have
     *  y=0, x^3 must be -7 mod p. However, -7 has no cube root mod p.
     *
     *  Having said this, if this function receives a point on a sextic twist, e.g. by
     *  a fault attack, it is possible for y to be 0. This happens for y^2 = x^3 + 6,
     *  since -6 does have a cube root mod p. For this point, this function will not set
     *  the infinity flag even though the point doubles to infinity, and the result
     *  point will be gibberish (z = 0 but infinity = 0).
     */
    if (a->infinity) {
        r->infinity = 1;
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        return;
    }

    if (rzr != NULL) {
        *rzr = a->y;
        secp256k1_fe_normalize_weak(rzr);
        secp256k1_fe_mul_int(rzr, 2);
    }

    secp256k1_gej_double(r, a);
}